

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_read_int(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  long lVar7;
  vm_val_t *in_RDX;
  uchar cbuf [4];
  size_t siz;
  long result;
  uint fmt;
  uint idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  byte local_54 [4];
  long local_50;
  size_t len;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  CVmObjByteArray *in_stack_ffffffffffffffd0;
  
  if ((getp_read_int(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_read_int(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_read_int::desc,2);
    __cxa_guard_release(&getp_read_int(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  len = 0;
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (iVar1 != 0) {
    return 1;
  }
  uVar2 = CVmBif::pop_int_val();
  uVar3 = CVmBif::pop_int_val();
  uVar4 = uVar3 & 0xf;
  if (uVar4 != 0) {
    if (uVar4 == 1) {
      local_50 = 2;
      goto LAB_002c3c52;
    }
    if (uVar4 == 2) {
      local_50 = 4;
      goto LAB_002c3c52;
    }
  }
  local_50 = 1;
LAB_002c3c52:
  if (uVar2 != 0) {
    uVar5 = ((ulong)uVar2 + local_50) - 1;
    uVar6 = get_element_count((CVmObjByteArray *)0x2c3c75);
    if (uVar5 <= uVar6) {
      copy_to_buf(in_stack_ffffffffffffffd0,(uchar *)CONCAT44(in_stack_ffffffffffffffcc,uVar2),
                  CONCAT44(uVar3,in_stack_ffffffffffffffc0),len);
      uVar2 = (uint)len;
      if (local_50 == 1) {
        if ((uVar3 & 0xf00) == 0) {
          uVar2 = (uint)(char)local_54[0];
        }
        else {
          uVar2 = (uint)local_54[0];
        }
      }
      else if (local_50 == 2) {
        if ((uVar3 & 0xf0) == 0x10) {
          swap_bytes(local_54,2);
        }
        if ((uVar3 & 0xf00) == 0) {
          uVar2 = ::osrp2s(local_54);
        }
        else {
          uVar2 = ::osrp2(local_54);
        }
      }
      else if (local_50 == 4) {
        if ((uVar3 & 0xf0) == 0x10) {
          swap_bytes(local_54,4);
        }
        if ((uVar3 & 0xf00) == 0) {
          lVar7 = osrp4s(local_54);
          uVar2 = (uint)lVar7;
        }
        else {
          uVar6 = ::osrp4(local_54);
          uVar2 = (uint)uVar6;
        }
      }
      vm_val_t::set_int(in_RDX,uVar2);
      return 1;
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjByteArray::getp_read_int(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(2);
    unsigned int idx;
    unsigned int fmt;
    long result = 0;
    size_t siz;
    unsigned char cbuf[4];

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the starting index and format code */
    idx = CVmBif::pop_int_val(vmg0_);
    fmt = CVmBif::pop_int_val(vmg0_);

    /* get the size from the format */
    switch (fmt & FmtSizeMask)
    {
    case FmtInt8:
    default:
        siz = 1;
        break;

    case FmtInt16:
        siz = 2;
        break;

    case FmtInt32:
        siz = 4;
        break;
    }

    /* check that the index is in range */
    if (idx < 1 || idx + siz - 1 > get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* make a copy of the bytes in cbuf[] for easy access */
    copy_to_buf(cbuf, idx, siz);

    /* read the value */
    switch (siz)
    {
    case 1:
        /* 8-bit integer - all that matters is the signedness */
        if ((fmt & FmtSignedMask) == FmtSigned)
            result = (long)(int)(char)cbuf[0];
        else
            result = cbuf[0];
        break;

    case 2:
        /* 
         *   16-bit integer.  Our standard portable order is little-endian,
         *   so swap bytes if it's big-endian.  
         */
        if ((fmt & FmtOrderMask) == FmtBigEndian)
            swap_bytes(cbuf, 2);

        /* it's little-endian now, so pull out the signed or unsigned value */
        if ((fmt & FmtSignedMask) == FmtSigned)
            result = osrp2s(cbuf);
        else
            result = osrp2(cbuf);

        break;

    case 4:
        /* 
         *   32-bit integer.  Convert to our standard little-endian ordering
         *   if it's currently big-endian, by swapping the byte order.
         */
        if ((fmt & FmtOrderMask) == FmtBigEndian)
            swap_bytes(cbuf, 4);

        /* it's little-endian now, so pull out the signed or unsigned value */
        if ((fmt & FmtSignedMask) == FmtSigned)
            result = osrp4s(cbuf);
        else
            result = osrp4(cbuf);
        break;
    }

    /* return the result */
    retval->set_int(result);

    /* handled */
    return TRUE;
}